

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.hpp
# Opt level: O3

void __thiscall Sinclair::ZXSpectrum::Video::State::State(State *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_30;
  
  (this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__005a31c0;
  this->border_colour = '\0';
  this->half_cycles_since_interrupt = 0;
  this->flash = false;
  this->flash_counter = 0;
  this->is_alternate_line = false;
  if (Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::contents__abi_cxx11_._M_h.
      _M_element_count == 0) {
    paVar1 = &local_30.field_2;
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"border_colour","");
    Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::declare_emplace<unsigned_char>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>,&this->border_colour,
               &local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"half_cycles_since_interrupt","");
    Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::declare_emplace<int>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>,
               &this->half_cycles_since_interrupt,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"flash","");
    Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::declare_emplace<bool>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>,&this->flash,&local_30,1)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"flash_counter","");
    Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::declare_emplace<int>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>,&this->flash_counter,
               &local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"is_alternate_line","");
    Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::declare_emplace<bool>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>,&this->is_alternate_line,
               &local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

State() {
		if(needs_declare()) {
			DeclareField(border_colour);
			DeclareField(half_cycles_since_interrupt);
			DeclareField(flash);
			DeclareField(flash_counter);
			DeclareField(is_alternate_line);
		}
	}